

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj.c
# Opt level: O0

int objisd(mcmcxdef *ctx,objdef *objptr,objnum parentnum)

{
  uint uVar1;
  int iVar2;
  void *p;
  ushort in_DX;
  mcmcxdef *in_RSI;
  objdef *curptr;
  int ret;
  int cursc;
  int cnt;
  uchar *sc;
  mcmon in_stack_ffffffffffffffbe;
  mcmcxdef *in_stack_ffffffffffffffc0;
  mcmon objnum;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  uint local_2c;
  undefined6 in_stack_ffffffffffffffe0;
  
  p = (void *)((long)&in_RSI->mcmcxmsz + 2);
  local_2c = osrp2((void *)((long)&in_RSI->mcmcxgl + 4));
  local_2c = local_2c & 0xffff;
  while( true ) {
    objnum = (mcmon)((ulong)in_stack_ffffffffffffffc0 >> 0x30);
    if (local_2c == 0) {
      return 0;
    }
    uVar1 = osrp2(p);
    if (uVar1 == in_DX) break;
    in_stack_ffffffffffffffc0 =
         (mcmcxdef *)
         mcmlck((mcmcxdef *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),objnum);
    iVar2 = objisd(in_RSI,(objdef *)CONCAT26(in_DX,in_stack_ffffffffffffffe0),
                   (objnum)((ulong)p >> 0x30));
    mcmunlck(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbe);
    if (iVar2 != 0) {
      return 1;
    }
    p = (void *)((long)p + 2);
    local_2c = local_2c - 1;
    in_stack_ffffffffffffffcc = 0;
  }
  return 1;
}

Assistant:

static int objisd(mcmcxdef *ctx, objdef *objptr, objnum parentnum)
{
    uchar *sc;
    int    cnt;
    
    for (sc = objsc(objptr), cnt = objnsc(objptr) ; cnt ;
         sc += 2, --cnt)
    {
        int     cursc = osrp2(sc);
        int     ret;
        objdef *curptr;
        
        if (cursc == parentnum) return(TRUE);
        
        curptr = (objdef *)mcmlck(ctx, (mcmon)cursc);
        ret = objisd(ctx, curptr, parentnum);
        mcmunlck(ctx, (mcmon)cursc);
        if (ret) return(TRUE);
    }
    return(FALSE);
}